

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::VirtualInterfaceType::fromSyntax
                 (ASTContext *context,VirtualInterfaceTypeSyntax *syntax)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view name;
  string_view name_00;
  SourceRange sourceRange_01;
  bool bVar1;
  Scope *pSVar2;
  DefinitionSymbol *pDVar3;
  Symbol *pSVar4;
  long in_RSI;
  SourceLocation in_RDI;
  Diagnostic *diag;
  Symbol *sym;
  string_view modportName;
  ModportSymbol *modport;
  ParameterValueAssignmentSyntax *in_stack_000000b8;
  InstanceSymbol *iface;
  SourceLocation loc;
  SourceLocation in_stack_000000d0;
  Symbol *def;
  string_view ifaceName;
  Compilation *comp;
  SourceLocation __len;
  SourceLocation args_3;
  InstanceSymbol *in_stack_fffffffffffffea8;
  SourceLocation in_stack_fffffffffffffeb0;
  ASTContext *in_stack_fffffffffffffeb8;
  SourceLocation args;
  SourceLocation in_stack_fffffffffffffec0;
  SourceLocation SVar5;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  Scope *in_stack_fffffffffffffef0;
  char *pcVar6;
  Compilation *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  DiagCode in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SourceLocation in_stack_ffffffffffffff20;
  SourceLocation in_stack_ffffffffffffff28;
  string_view local_c8;
  ModportSymbol *local_b8;
  SourceLocation local_b0;
  InstanceSymbol *local_a8;
  SourceLocation local_a0;
  size_t local_98;
  char *local_90;
  SourceRange local_88;
  undefined4 local_78;
  undefined4 local_74;
  SourceRange local_70;
  size_t local_60;
  char *local_58;
  int *local_50;
  int *local_38;
  string_view local_30;
  SourceLocation local_20;
  long local_18;
  SourceLocation local_10;
  VirtualInterfaceType *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0x553464);
  local_30 = parsing::Token::valueText((Token *)in_stack_fffffffffffffeb0);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_30);
  if (bVar1) {
    local_8 = (VirtualInterfaceType *)Compilation::getErrorType((Compilation *)local_20);
  }
  else {
    local_60 = local_30._M_len;
    local_58 = local_30._M_str;
    SVar5 = local_20;
    pSVar2 = not_null<const_slang::ast::Scope_*>::operator*
                       ((not_null<const_slang::ast::Scope_*> *)0x5534f4);
    code = SUB84((ulong)pSVar2 >> 0x20,0);
    local_70 = parsing::Token::range((Token *)in_stack_fffffffffffffec0);
    local_74 = 0xce0006;
    name_00._M_str._0_4_ = in_stack_ffffffffffffff10;
    name_00._M_len = (size_t)in_stack_ffffffffffffff08;
    name_00._M_str._4_4_ = in_stack_ffffffffffffff14;
    sourceRange_01.endLoc = in_stack_ffffffffffffff28;
    sourceRange_01.startLoc = in_stack_ffffffffffffff20;
    __len = local_70.startLoc;
    args_3 = local_70.endLoc;
    Compilation::getDefinition
              (in_stack_fffffffffffffef8,name_00,in_stack_fffffffffffffef0,sourceRange_01,
               in_stack_ffffffffffffff04);
    local_38 = local_50;
    if (((local_50 == (int *)0x0) || (*local_50 != 2)) ||
       (pDVar3 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x5535a3),
       pDVar3->definitionKind != Interface)) {
      if (local_38 != (int *)0x0) {
        local_78 = 0xce0006;
        local_88 = parsing::Token::range((Token *)local_10);
        sourceRange.endLoc = SVar5;
        sourceRange.startLoc = local_10;
        ASTContext::addDiag(in_stack_fffffffffffffeb8,code,sourceRange);
        local_98 = local_30._M_len;
        local_90 = local_30._M_str;
        arg._M_str = (char *)in_stack_fffffffffffffef0;
        arg._M_len = in_stack_fffffffffffffee8;
        Diagnostic::operator<<(in_stack_fffffffffffffee0,arg);
      }
      local_8 = (VirtualInterfaceType *)Compilation::getErrorType((Compilation *)local_20);
    }
    else {
      local_b0 = parsing::Token::location((Token *)(local_18 + 0x38));
      args = local_10;
      local_a0 = local_b0;
      Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x5536ad);
      local_a8 = InstanceSymbol::createVirtual
                           ((ASTContext *)loc,in_stack_000000d0,(DefinitionSymbol *)iface,
                            in_stack_000000b8);
      Compilation::noteVirtualIfaceInstance
                ((Compilation *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_b8 = (ModportSymbol *)0x0;
      if (*(long *)(local_18 + 0x50) == 0) {
        local_c8 = sv((char *)args_3,(size_t)__len);
      }
      else {
        local_c8 = parsing::Token::valueText((Token *)in_stack_fffffffffffffeb0);
      }
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_c8);
      if ((!bVar1) && (*(long *)(local_18 + 0x50) != 0)) {
        name._M_len._4_4_ = in_stack_ffffffffffffff04;
        name._M_len._0_4_ = in_stack_ffffffffffffff00;
        name._M_str = in_stack_ffffffffffffff08;
        pSVar4 = Scope::find((Scope *)in_stack_fffffffffffffef8,name);
        if ((pSVar4 == (Symbol *)0x0) || (pSVar4->kind != Modport)) {
          parsing::Token::range((Token *)in_stack_fffffffffffffec0);
          sourceRange_00.endLoc = SVar5;
          sourceRange_00.startLoc = in_stack_fffffffffffffec0;
          ASTContext::addDiag((ASTContext *)args,code,sourceRange_00);
          arg_00._M_str = (char *)local_c8._M_len;
          arg_00._M_len = in_stack_fffffffffffffee8;
          pcVar6 = (char *)local_c8._M_len;
          Diagnostic::operator<<(in_stack_fffffffffffffee0,arg_00);
          arg_01._M_str = pcVar6;
          arg_01._M_len = *(size_t *)(local_38 + 4);
          Diagnostic::operator<<(*(Diagnostic **)(local_38 + 2),arg_01);
          in_stack_fffffffffffffeb0 = local_10;
        }
        else {
          local_b8 = Symbol::as<slang::ast::ModportSymbol>((Symbol *)0x5538a9);
        }
      }
      local_8 = BumpAllocator::
                emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation&>
                          ((BumpAllocator *)in_stack_fffffffffffffec0,(InstanceSymbol *)args,
                           (ModportSymbol **)in_stack_fffffffffffffeb0,
                           (bool *)in_stack_fffffffffffffea8,(SourceLocation *)args_3);
    }
  }
  return &local_8->super_Type;
}

Assistant:

const Type& VirtualInterfaceType::fromSyntax(const ASTContext& context,
                                             const VirtualInterfaceTypeSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto ifaceName = syntax.name.valueText();
    if (ifaceName.empty())
        return comp.getErrorType();

    auto def = comp.getDefinition(ifaceName, *context.scope, syntax.name.range(),
                                  diag::UnknownInterface)
                   .definition;

    if (!def || def->kind != SymbolKind::Definition ||
        def->as<DefinitionSymbol>().definitionKind != DefinitionKind::Interface) {

        // If we got a result from getDefinition then it didn't error, so issue
        // one ourselves since we didn't find an interface.
        if (def)
            context.addDiag(diag::UnknownInterface, syntax.name.range()) << ifaceName;
        return comp.getErrorType();
    }

    auto loc = syntax.name.location();
    auto& iface = InstanceSymbol::createVirtual(context, loc, def->as<DefinitionSymbol>(),
                                                syntax.parameters);
    comp.noteVirtualIfaceInstance(iface);

    const ModportSymbol* modport = nullptr;
    std::string_view modportName = syntax.modport ? syntax.modport->member.valueText() : ""sv;
    if (!modportName.empty() && syntax.modport) {
        auto sym = iface.body.find(modportName);
        if (!sym || sym->kind != SymbolKind::Modport) {
            SLANG_ASSERT(syntax.modport);
            auto& diag = context.addDiag(diag::NotAModport, syntax.modport->member.range());
            diag << modportName;
            diag << def->name;
        }
        else {
            modport = &sym->as<ModportSymbol>();
        }
    }

    return *comp.emplace<VirtualInterfaceType>(iface, modport, /* isRealIface */ false, loc);
}